

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

bool __thiscall SimpleLogger::flush(SimpleLogger *this,size_t start_pos)

{
  char *pcVar1;
  pointer pLVar2;
  atomic<SimpleLoggerMgr_*> this_00;
  int iVar3;
  CompElem *elem;
  long lVar4;
  ulong uVar5;
  long lVar6;
  unique_lock<std::mutex> ll;
  unique_lock<std::mutex> local_60;
  string local_50;
  
  local_60._M_device = &this->flushingLogs;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)local_60._M_device);
  local_60._M_owns = iVar3 == 0;
  if (local_60._M_owns) {
    uVar5 = ((long)(this->logs).
                   super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->logs).
                   super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xff00ff00ff00ff;
    lVar6 = uVar5 - start_pos;
    if (start_pos <= uVar5 && lVar6 != 0) {
      lVar4 = start_pos * 0x1010 + 0x1008;
      do {
        pLVar2 = (this->logs).
                 super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar1 = pLVar2->ctx + lVar4 + -8;
        LOCK();
        if (*(int *)pcVar1 == 2) {
          pcVar1[0] = '\x03';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
        }
        UNLOCK();
        if (*(int *)pcVar1 == 2) {
          std::ostream::write((char *)&this->fs,(long)pLVar2 + lVar4 + -0x1000);
          LOCK();
          pcVar1 = pLVar2->ctx + lVar4 + -8;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          UNLOCK();
        }
        lVar4 = lVar4 + 0x1010;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    if (start_pos != 0) {
      lVar6 = 0x1008;
      do {
        pLVar2 = (this->logs).
                 super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar1 = pLVar2->ctx + lVar6 + -8;
        LOCK();
        if (*(int *)pcVar1 == 2) {
          pcVar1[0] = '\x03';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
        }
        UNLOCK();
        if (*(int *)pcVar1 == 2) {
          std::ostream::write((char *)&this->fs,lVar6 + -0x1000 + (long)pLVar2);
          LOCK();
          pcVar1 = pLVar2->ctx + lVar6 + -8;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          UNLOCK();
        }
        lVar6 = lVar6 + 0x1010;
        start_pos = start_pos - 1;
      } while (start_pos != 0);
    }
    std::ostream::flush();
    if ((this->maxLogFileSize != 0) &&
       (lVar6 = std::ostream::tellp(), (long)this->maxLogFileSize < lVar6)) {
      this->curRevnum = this->curRevnum + 1;
      std::ofstream::close();
      getLogFilePath_abi_cxx11_(&local_50,this,this->curRevnum);
      std::ofstream::open((string *)&this->fs,(_Ios_Openmode)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_00._M_b._M_p = SimpleLoggerMgr::instance._M_b._M_p;
      if (SimpleLoggerMgr::instance._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        (this->numCompJobs).super___atomic_base<unsigned_int>._M_i =
             (this->numCompJobs).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        elem = (CompElem *)operator_new(0x10);
        elem->fileNum = this->curRevnum - 1;
        elem->targetLogger = this;
        SimpleLoggerMgr::addCompElem((SimpleLoggerMgr *)this_00._M_b._M_p,elem);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return iVar3 == 0;
}

Assistant:

bool SimpleLogger::flush(size_t start_pos) {
    std::unique_lock<std::mutex> ll(flushingLogs, std::try_to_lock);
    if (!ll.owns_lock()) return false;

    size_t num = logs.size();
    // Circular flush into file.
    for (size_t ii=start_pos; ii<num; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    for (size_t ii=0; ii<start_pos; ++ii) {
        LogElem& ll = logs[ii];
        ll.flush(fs);
    }
    fs.flush();

    if ( maxLogFileSize &&
         fs.tellp() > (int64_t)maxLogFileSize ) {
        // Exceeded limit, make a new file.
        curRevnum++;
        fs.close();
        fs.open(getLogFilePath(curRevnum), std::ofstream::out | std::ofstream::app);

        // Compress it (tar gz). Register to the global queue.
        SimpleLoggerMgr* mgr = SimpleLoggerMgr::getWithoutInit();
        if (mgr) {
            numCompJobs.fetch_add(1);
            SimpleLoggerMgr::CompElem* elem =
                new SimpleLoggerMgr::CompElem(curRevnum-1, this);
            mgr->addCompElem(elem);
        }
    }

    return true;
}